

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void bcemit_branch_t(FuncState *fs,ExpDesc *e)

{
  ExpKind EVar1;
  BCPos l2;
  
  expr_discharge(fs,e);
  EVar1 = e->k;
  if (EVar1 - VKTRUE < 3) {
    l2 = 0xffffffff;
  }
  else if (EVar1 < VKTRUE) {
    expr_toreg_nobranch(fs,e,0xff);
    l2 = bcemit_jmp(fs);
  }
  else if (EVar1 == VJMP) {
    *(byte *)&fs->bcbase[(e->u).s.info - 1].ins = (byte)fs->bcbase[(e->u).s.info - 1].ins ^ 1;
    l2 = (e->u).s.info;
  }
  else {
    l2 = bcemit_branch(fs,e,0);
  }
  jmp_append(fs,&e->f,l2);
  jmp_tohere(fs,e->t);
  e->t = 0xffffffff;
  return;
}

Assistant:

static void bcemit_branch_t(FuncState *fs, ExpDesc *e)
{
  BCPos pc;
  expr_discharge(fs, e);
  if (e->k == VKSTR || e->k == VKNUM || e->k == VKTRUE)
    pc = NO_JMP;  /* Never jump. */
  else if (e->k == VJMP)
    invertcond(fs, e), pc = e->u.s.info;
  else if (e->k == VKFALSE || e->k == VKNIL)
    expr_toreg_nobranch(fs, e, NO_REG), pc = bcemit_jmp(fs);
  else
    pc = bcemit_branch(fs, e, 0);
  jmp_append(fs, &e->f, pc);
  jmp_tohere(fs, e->t);
  e->t = NO_JMP;
}